

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::WriteCacheFile(cmDependsC *this)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  reference ppVar6;
  reference pUVar7;
  UnscannedEntry *inc;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_> *__range3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>
  *fileIt;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
  *__range1;
  undefined1 local_210 [8];
  ofstream cacheOut;
  cmDependsC *this_local;
  
  cacheOut._504_8_ = this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_210,pcVar4,_S_out);
    bVar1 = std::ios::operator!((ios *)(local_210 + (long)*(_func_int **)((long)local_210 + -0x18)))
    ;
    if ((bVar1 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)local_210,(string *)&this->IncludeRegexLineString);
      std::operator<<(poVar5,"\n\n");
      poVar5 = std::operator<<((ostream *)local_210,(string *)&this->IncludeRegexScanString);
      std::operator<<(poVar5,"\n\n");
      poVar5 = std::operator<<((ostream *)local_210,(string *)&this->IncludeRegexComplainString);
      std::operator<<(poVar5,"\n\n");
      poVar5 = std::operator<<((ostream *)local_210,(string *)&this->IncludeRegexTransformString);
      std::operator<<(poVar5,"\n\n");
      __end1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
               ::begin(&this->FileCache);
      fileIt = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
                  ::end(&this->FileCache);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&fileIt), bVar2) {
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>
                 ::operator*(&__end1);
        if (((ppVar6->second).Used & 1U) != 0) {
          poVar5 = std::operator<<((ostream *)local_210,(string *)ppVar6);
          std::operator<<(poVar5,'\n');
          __end3 = std::
                   vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                   begin(&(ppVar6->second).UnscannedEntries);
          inc = (UnscannedEntry *)
                std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                ::end(&(ppVar6->second).UnscannedEntries);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
                                             *)&inc), bVar2) {
            pUVar7 = __gnu_cxx::
                     __normal_iterator<const_cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
                     ::operator*(&__end3);
            poVar5 = std::operator<<((ostream *)local_210,(string *)pUVar7);
            std::operator<<(poVar5,'\n');
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              poVar5 = std::operator<<((ostream *)local_210,(string *)&pUVar7->QuotedLocation);
              std::operator<<(poVar5,'\n');
            }
            else {
              poVar5 = std::operator<<((ostream *)local_210,'-');
              std::operator<<(poVar5,'\n');
            }
            __gnu_cxx::
            __normal_iterator<const_cmDependsC::UnscannedEntry_*,_std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
            ::operator++(&__end3);
          }
          std::operator<<((ostream *)local_210,'\n');
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>
        ::operator++(&__end1);
      }
    }
    std::ofstream::~ofstream(local_210);
  }
  return;
}

Assistant:

void cmDependsC::WriteCacheFile() const
{
  if (this->CacheFileName.empty()) {
    return;
  }
  cmsys::ofstream cacheOut(this->CacheFileName.c_str());
  if (!cacheOut) {
    return;
  }

  cacheOut << this->IncludeRegexLineString << "\n\n";
  cacheOut << this->IncludeRegexScanString << "\n\n";
  cacheOut << this->IncludeRegexComplainString << "\n\n";
  cacheOut << this->IncludeRegexTransformString << "\n\n";

  for (auto const& fileIt : this->FileCache) {
    if (fileIt.second.Used) {
      cacheOut << fileIt.first << '\n';

      for (UnscannedEntry const& inc : fileIt.second.UnscannedEntries) {
        cacheOut << inc.FileName << '\n';
        if (inc.QuotedLocation.empty()) {
          cacheOut << '-' << '\n';
        } else {
          cacheOut << inc.QuotedLocation << '\n';
        }
      }
      cacheOut << '\n';
    }
  }
}